

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_test.cc
# Opt level: O2

void __thiscall
(anonymous_namespace)::SADx3Test_ShortRef_Test::~SADx3Test_ShortRef_Test
          (SADx3Test_ShortRef_Test *this)

{
  anon_unknown.dwarf_1c2f005::SADx3Test_ShortRef_Test::~SADx3Test_ShortRef_Test
            ((SADx3Test_ShortRef_Test *)(this + -8));
  return;
}

Assistant:

TEST_P(SADx3Test, ShortRef) {
  int tmp_stride = reference_stride_;
  reference_stride_ >>= 1;
  FillRandom(source_data_, source_stride_);
  FillRandom(GetReference(0), reference_stride_);
  FillRandom(GetReference(1), reference_stride_);
  FillRandom(GetReference(2), reference_stride_);
  FillRandom(GetReference(3), reference_stride_);
  CheckSADs();
  reference_stride_ = tmp_stride;
}